

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O3

bool testing::internal::InDeathTestChild(void)

{
  byte bVar1;
  int iVar2;
  
  iVar2 = std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::compare
                    ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &FLAGS_gtest_death_test_style_abi_cxx11_,"threadsafe");
  bVar1 = g_in_fast_death_test_child;
  if (iVar2 == 0) {
    bVar1 = DAT_00150550 != 0;
  }
  return (bool)(bVar1 & 1);
}

Assistant:

bool InDeathTestChild() {
#if defined(GTEST_OS_WINDOWS) || defined(GTEST_OS_FUCHSIA)

  // On Windows and Fuchsia, death tests are thread-safe regardless of the value
  // of the death_test_style flag.
  return !GTEST_FLAG_GET(internal_run_death_test).empty();

#else

  if (GTEST_FLAG_GET(death_test_style) == "threadsafe")
    return !GTEST_FLAG_GET(internal_run_death_test).empty();
  else
    return g_in_fast_death_test_child;
#endif
}